

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

int32 gflags::Int32FromEnv(char *v,int32 dflt)

{
  int iVar1;
  int32 dflt_local;
  char *v_local;
  
  iVar1 = anon_unknown_2::GetFromEnv<int>(v,dflt);
  return iVar1;
}

Assistant:

int32 Int32FromEnv(const char *v, int32 dflt) {
  return GetFromEnv(v, dflt);
}